

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<char,_false>_> __thiscall
immutable::rrb_details::set_sizes<char,false,5>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<char,_false>_> *node,
          uint32_t shift)

{
  uint uVar1;
  uint32_t uVar2;
  internal_node<char,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_38;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  uint32_t i;
  uint32_t child_shift;
  ref<immutable::rrb_details::rrb_size_table<false>_> table;
  uint32_t sum;
  uint32_t shift_local;
  ref<immutable::rrb_details::internal_node<char,_false>_> *node_local;
  
  table.ptr._0_4_ = 0;
  table.ptr._4_4_ = shift;
  piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
  prVar4 = size_table_create<false>(piVar3->len);
  ref<immutable::rrb_details::rrb_size_table<false>_>::ref
            ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i,prVar4);
  child.ptr._4_4_ = table.ptr._4_4_ - 5;
  child.ptr._0_4_ = 0;
  while( true ) {
    uVar1 = (uint)child.ptr;
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
    if (piVar3->len <= uVar1) break;
    piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::internal_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_38,
               piVar3->child + (uint)child.ptr);
    uVar2 = size_sub_trie<char,false,5>(&local_38,child.ptr._4_4_);
    uVar2 = uVar2 + (uint32_t)table.ptr;
    table.ptr._0_4_ = uVar2;
    prVar4 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                       ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i);
    prVar4->size[(uint)child.ptr] = uVar2;
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_38);
    child.ptr._0_4_ = (uint)child.ptr + 1;
  }
  piVar3 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(node);
  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
            (&piVar3->size_table,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&i);
  ref<immutable::rrb_details::internal_node<char,_false>_>::ref
            ((ref<immutable::rrb_details::internal_node<char,_false>_> *)this,node);
  ref<immutable::rrb_details::rrb_size_table<false>_>::~ref
            ((ref<immutable::rrb_details::rrb_size_table<false>_> *)&i);
  return (ref<immutable::rrb_details::internal_node<char,_false>_>)
         (internal_node<char,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> set_sizes(ref<internal_node<T, atomic_ref_counting>>& node, uint32_t shift)
      {
      uint32_t sum = 0;
      ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(node->len);
      const uint32_t child_shift = shift - bits<N>::rrb_bits;

      for (uint32_t i = 0; i < node->len; i++)
        {
        ref<tree_node<T, atomic_ref_counting>> child = node->child[i];
        sum += size_sub_trie<T, atomic_ref_counting, N>(child, child_shift);
        table->size[i] = sum;
        }
      node->size_table = table;
      return node;
      }